

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t find_last_nonempty_line(Terminal *term,tree234 *screen)

{
  uint uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  wchar_t index;
  ulong uVar7;
  
  wVar3 = count234(screen);
  do {
    index = wVar3 + L'\xffffffff';
    if (wVar3 < L'\x01') {
      return index;
    }
    pvVar4 = index234(screen,index);
    uVar1 = *(uint *)((long)pvVar4 + 4);
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    lVar6 = 0;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      _Var2 = termchars_equal((termchar *)(*(long *)((long)pvVar4 + 0x18) + lVar6),&term->erase_char
                             );
      if (!_Var2) {
        uVar5 = uVar7 & 0xffffffff;
        break;
      }
      lVar6 = lVar6 + 0x20;
    }
    wVar3 = index;
    if ((uint)uVar5 != uVar1) {
      return index;
    }
  } while( true );
}

Assistant:

static int find_last_nonempty_line(Terminal * term, tree234 * screen)
{
    int i;
    for (i = count234(screen) - 1; i >= 0; i--) {
        termline *line = index234(screen, i);
        int j;
        for (j = 0; j < line->cols; j++)
            if (!termchars_equal(&line->chars[j], &term->erase_char))
                break;
        if (j != line->cols) break;
    }
    return i;
}